

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_DetachItemFromObjectCaseSensitive(cJSON *object,char *string)

{
  cJSON *pcVar1;
  
  pcVar1 = get_object_item(object,string,1);
  pcVar1 = cJSON_DetachItemViaPointer(object,pcVar1);
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_DetachItemFromObjectCaseSensitive(cJSON *object, const char *string)
{
    cJSON *to_detach = cJSON_GetObjectItemCaseSensitive(object, string);

    return cJSON_DetachItemViaPointer(object, to_detach);
}